

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::Option::set
          (string *__return_storage_ptr__,Option *this,OptionCallback *target,string_view param_2,
          string_view value)

{
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(__return_storage_ptr__,target,value);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(OptionCallback& target, string_view, string_view value) {
    return target(value);
}